

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O2

int rottenfood(obj *obj)

{
  boolean bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  
  pcVar4 = foodword(obj);
  pline("Blecch!  Rotten %s!",pcVar4);
  uVar2 = mt_random();
  if ((uVar2 & 3) == 0) {
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
      pcVar4 = body_part(10);
      pline("You feel rather %s.",pcVar4);
    }
    else {
      pline("You feel rather trippy.");
    }
    uVar2 = u.uprops[0x1c].intrinsic;
    iVar3 = dice(2,4);
    make_confused((ulong)(uVar2 + iVar3),'\0');
    return 0;
  }
  uVar2 = mt_random();
  if ((uVar2 & 3) == 0) {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0018d5d8;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0018d5cf;
LAB_0018d636:
      pline("Everything suddenly goes dark.");
      iVar3 = dice(2,10);
      make_blinded((long)iVar3,'\0');
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
          if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_0018d748;
          goto LAB_0018d66c;
        }
      }
      else {
LAB_0018d66c:
        if (ublindf == (obj *)0x0) {
          return 0;
        }
      }
      if (ublindf->oartifact != '\x1d') {
        return 0;
      }
LAB_0018d748:
      pline("Your vision quickly clears.");
      return 0;
    }
LAB_0018d5cf:
    if (ublindf != (obj *)0x0) {
LAB_0018d5d8:
      if (ublindf->oartifact == '\x1d') goto LAB_0018d636;
    }
  }
  uVar2 = mt_random();
  if (uVar2 % 3 != 0) {
    return 0;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0018d4c2;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0018d4bd;
LAB_0018d6ac:
    pcVar4 = "dark";
    pcVar5 = "goes";
  }
  else {
LAB_0018d4bd:
    if (ublindf != (obj *)0x0) {
LAB_0018d4c2:
      if (ublindf->oartifact == '\x1d') goto LAB_0018d6ac;
    }
    pcVar4 = "yourself";
    pcVar5 = "you lose control of";
    if ((((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) &&
         ((youmonst.data)->mlet != '\x05')) &&
        (bVar1 = on_level(&u.uz,&dungeon_topology.d_air_level), bVar1 == '\0')) &&
       (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar1 == '\0')) {
      pcVar5 = "you slap against the";
      if (u.usteed == (monst *)0x0) {
        pcVar4 = surface((int)u.ux,(int)u.uy);
      }
      else {
        pcVar4 = "saddle";
      }
    }
  }
  pline("The world spins and %s %s.",pcVar5,pcVar4);
  flags.soundok = '\0';
  iVar3 = rnd(10);
  nomul(-iVar3,"unconscious from rotten food");
  nomovemsg = "You are conscious again.";
  afternmv = Hear_again;
  return 1;
}

Assistant:

static int rottenfood(struct obj *obj)
{
	pline("Blecch!  Rotten %s!", foodword(obj));
	if (!rn2(4)) {
		if (Hallucination) pline("You feel rather trippy.");
		else pline("You feel rather %s.", body_part(LIGHT_HEADED));
		make_confused(HConfusion + dice(2,4), FALSE);
	} else if (!rn2(4) && !Blind) {
		pline("Everything suddenly goes dark.");
		make_blinded((long)dice(2,10), FALSE);
		if (!Blind) pline("Your vision quickly clears.");
	} else if (!rn2(3)) {
		const char *what, *where;
		if (!Blind)
		    what = "goes",  where = "dark";
		else if (Levitation || Is_airlevel(&u.uz) ||
			 Is_waterlevel(&u.uz))
		    what = "you lose control of",  where = "yourself";
		else
		    what = "you slap against the", where =
			   (u.usteed) ? "saddle" :
			   surface(u.ux,u.uy);
		pline("The world spins and %s %s.", what, where);
		flags.soundok = 0;
		nomul(-rnd(10), "unconscious from rotten food");
		nomovemsg = "You are conscious again.";
		afternmv = Hear_again;
		return 1;
	}
	return 0;
}